

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_subject_set_by_edition_removes_all_older_edition_subject_sets_Test::TestBody
          (SubjectSetRegisterTest_subject_set_by_edition_removes_all_older_edition_subject_sets_Test
           *this)

{
  bool bVar1;
  char *pcVar2;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *pvVar3;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *pvVar4;
  char *in_R9;
  AssertHelper local_3b8;
  Message local_3b0;
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  local_3a8;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_1;
  Message local_370;
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  local_368;
  undefined1 local_348 [8];
  AssertionResult gtest_ar;
  AssertHelper local_318;
  Message local_310;
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  local_308;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_2b0;
  Message local_2a8;
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  local_2a0;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_;
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  subject_set3;
  Subject local_1d8 [24];
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_1c0;
  Subject local_150 [24];
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_138;
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_subject_set_by_edition_removes_all_older_edition_subject_sets_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_138);
  bidfx_public_api::price::subject::Subject::Subject(local_150,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_150,0);
  subject::Subject::~Subject(local_150);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_1c0);
  bidfx_public_api::price::subject::Subject::Subject(local_1d8,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_1d8,0);
  subject::Subject::~Subject(local_1d8);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &subject_set3.
              super__Optional_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
              ._M_engaged);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((int)&gtest_ar_ + 8);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((uint)&local_2a0);
  local_279 = std::optional::operator_cast_to_bool((optional *)&local_2a0);
  local_279 = !local_279;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_278,&local_279,(type *)0x0);
  std::
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::~optional(&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_278,(AssertionResult *)0x32fd1e,
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((uint)&local_308);
  local_2e1 = std::optional::operator_cast_to_bool((optional *)&local_308);
  local_2e1 = !local_2e1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
  std::
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::~optional(&local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2e0,(AssertionResult *)0x32fd47,"true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x15c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  pvVar3 = std::
           optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
           ::operator*((optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                        *)&gtest_ar_.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((uint)&local_368);
  pvVar4 = std::
           optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
           ::operator*(&local_368);
  testing::internal::EqHelper<false>::
  Compare<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((EqHelper<false> *)local_348,"*subject_set3","*subject_register.SubjectSetByEdition(3)"
             ,pvVar3,pvVar4);
  std::
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::~optional(&local_368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x15d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  pvVar3 = std::
           optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
           ::operator*((optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                        *)&gtest_ar_.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((uint)&local_3a8);
  pvVar4 = std::
           optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
           ::operator*(&local_3a8);
  testing::internal::EqHelper<false>::
  Compare<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((EqHelper<false> *)local_388,"*subject_set3","*subject_register.SubjectSetByEdition(3)"
             ,pvVar3,pvVar4);
  std::
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::~optional(&local_3a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  std::
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::~optional((optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
               *)&gtest_ar_.message_);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, subject_set_by_edition_removes_all_older_edition_subject_sets)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.NextSubscriptionSync();
    subject_register.Register(SS_SUBJECT1, false);
    subject_register.NextSubscriptionSync();
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.NextSubscriptionSync();

    auto subject_set3 = subject_register.SubjectSetByEdition(3);
    EXPECT_FALSE(subject_register.SubjectSetByEdition(1));
    EXPECT_FALSE(subject_register.SubjectSetByEdition(2));
    EXPECT_EQ(*subject_set3, *subject_register.SubjectSetByEdition(3));
    EXPECT_EQ(*subject_set3, *subject_register.SubjectSetByEdition(3));
}